

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstylesheetstyle.cpp
# Opt level: O3

void __thiscall QRenderRule::drawBackground(QRenderRule *this,QPainter *p,QRect *rect,QPoint *off)

{
  QStyleSheetBackgroundData *pQVar1;
  char cVar2;
  Origin origin;
  long in_FS_OFFSET;
  QRect r;
  QRect QVar3;
  QBrush brush;
  QRect local_58;
  undefined1 local_48 [16];
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_48._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
  if ((this->bg).d.ptr == (QStyleSheetBackgroundData *)0x0) {
LAB_00355c12:
    QBrush::QBrush((QBrush *)(local_48 + 8));
  }
  else {
    cVar2 = QPixmap::isNull();
    pQVar1 = (this->bg).d.ptr;
    if ((cVar2 != '\0') && (*(int *)(*(long *)&pQVar1->brush + 4) == 0)) goto LAB_00355c12;
    QBrush::QBrush((QBrush *)(local_48 + 8),&pQVar1->brush);
  }
  if (*(int *)(local_48._8_8_ + 4) == 0) {
    QBrush::operator=((QBrush *)(local_48 + 8),&this->defaultBackground);
    if (*(int *)(local_48._8_8_ + 4) == 0) goto LAB_00355d14;
  }
  origin = Origin_Border;
  if ((this->bg).d.ptr != (QStyleSheetBackgroundData *)0x0) {
    cVar2 = QPixmap::isNull();
    pQVar1 = (this->bg).d.ptr;
    if ((cVar2 == '\0') || (*(int *)(*(long *)&pQVar1->brush + 4) != 0)) {
      origin = pQVar1->clip;
    }
  }
  QVar3 = originRect(this,rect,origin);
  r.x2.m_i = (int)QVar3._0_8_;
  r.y2.m_i = (int)((ulong)QVar3._0_8_ >> 0x20);
  r._0_8_ = this;
  borderClip((QRenderRule *)local_48,r);
  cVar2 = QPainterPath::isEmpty();
  if (cVar2 == '\0') {
    QPainter::renderHints();
    QPainter::setRenderHint((RenderHint)p,true);
    QPainter::fillPath((QPainterPath *)p,(QBrush *)local_48);
    QPainter::setRenderHint((RenderHint)p,true);
  }
  else {
    local_58 = originRect(this,rect,origin);
    QPainter::fillRect((QRect *)p,(QBrush *)&local_58);
  }
  QPainterPath::~QPainterPath((QPainterPath *)local_48);
LAB_00355d14:
  drawBackgroundImage(this,p,rect,*off);
  QBrush::~QBrush((QBrush *)(local_48 + 8));
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QRenderRule::drawBackground(QPainter *p, const QRect& rect, const QPoint& off)
{
    QBrush brush = hasBackground() ? background()->brush : QBrush();
    if (brush.style() == Qt::NoBrush)
        brush = defaultBackground;

    if (brush.style() != Qt::NoBrush) {
        Origin origin = hasBackground() ? background()->clip : Origin_Border;
        // ### fix for  gradients
        const QPainterPath &borderPath = borderClip(originRect(rect, origin));
        if (!borderPath.isEmpty()) {
            // Drawn instead of being used as clipping path for better visual quality
            bool wasAntialiased = p->renderHints() & QPainter::Antialiasing;
            p->setRenderHint(QPainter::Antialiasing);
            p->fillPath(borderPath, brush);
            p->setRenderHint(QPainter::Antialiasing, wasAntialiased);
        } else {
            p->fillRect(originRect(rect, origin), brush);
        }
    }

    drawBackgroundImage(p, rect, off);
}